

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

bool __thiscall iDynTree::XMLParser::parseXMLString(XMLParser *this,string *xmlString)

{
  bool bVar1;
  int iVar2;
  
  xmlCheckVersion(0x51b1);
  XMLParserState::resetState
            (&((this->m_pimpl)._M_t.
               super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
               .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl)->
              m_parserState);
  iVar2 = xmlSAXUserParseMemory
                    ((this->m_pimpl)._M_t.
                     super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                     .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>.
                     _M_head_impl,this,(xmlString->_M_dataplus)._M_p,
                     (int)xmlString->_M_string_length);
  if (iVar2 == 0) {
    bVar1 = XMLParserState::getParsingErrorState
                      (&((this->m_pimpl)._M_t.
                         super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>.
                        _M_head_impl)->m_parserState);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool XMLParser::parseXMLString(std::string xmlString)
    {
        assert(m_pimpl);
        LIBXML_TEST_VERSION

        // Reset the failure state.
        m_pimpl->m_parserState.resetState();

        // For now we do not support validation on the fly

        int result = xmlSAXUserParseMemory(m_pimpl->callbackHandler(), this, xmlString.c_str(), xmlString.length());
        return result == 0 && !m_pimpl->m_parserState.getParsingErrorState();
    }